

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O0

void __thiscall DPSprite::Destroy(DPSprite *this)

{
  bool bVar1;
  DPSprite *pDVar2;
  bool local_21;
  DPSprite *local_18;
  DPSprite *prev;
  DPSprite *this_local;
  
  if ((this->Owner != (player_t *)0x0) &&
     (bVar1 = TObjPtr<DPSprite>::operator!=(&this->Owner->psprites,(DPSprite *)0x0), bVar1)) {
    bVar1 = TObjPtr<DPSprite>::operator!=(&this->Owner->psprites,this);
    if (bVar1) {
      local_18 = ::TObjPtr::operator_cast_to_DPSprite_((TObjPtr *)&this->Owner->psprites);
      while( true ) {
        local_21 = false;
        if (local_18 != (DPSprite *)0x0) {
          local_21 = TObjPtr<DPSprite>::operator!=(&local_18->Next,this);
        }
        if (local_21 == false) break;
        local_18 = ::TObjPtr::operator_cast_to_DPSprite_((TObjPtr *)&local_18->Next);
      }
      if ((local_18 != (DPSprite *)0x0) &&
         (bVar1 = TObjPtr<DPSprite>::operator==(&local_18->Next,this), bVar1)) {
        (local_18->Next).field_0 = (this->Next).field_0;
        pDVar2 = ::TObjPtr::operator_cast_to_DPSprite_((TObjPtr *)&this->Next);
        GC::WriteBarrier(&local_18->super_DObject,&pDVar2->super_DObject);
      }
    }
    else {
      (this->Owner->psprites).field_0 = (this->Next).field_0;
      pDVar2 = ::TObjPtr::operator_cast_to_DPSprite_((TObjPtr *)&this->Next);
      GC::WriteBarrier(&pDVar2->super_DObject);
    }
  }
  DObject::Destroy(&this->super_DObject);
  return;
}

Assistant:

void DPSprite::Destroy()
{
	// Do not crash if this gets called on partially initialized objects.
	if (Owner != nullptr && Owner->psprites != nullptr)
	{
		if (Owner->psprites != this)
		{
			DPSprite *prev = Owner->psprites;
			while (prev != nullptr && prev->Next != this)
				prev = prev->Next;

			if (prev != nullptr && prev->Next == this)
			{
				prev->Next = Next;
				GC::WriteBarrier(prev, Next);
			}
		}
		else
		{
			Owner->psprites = Next;
			GC::WriteBarrier(Next);
		}
	}
	Super::Destroy();
}